

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O0

void __thiscall
TailContext::TailContext
          (TailContext *this,shared_ptr<SchemeProcedure> *func,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args
          )

{
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args_local;
  shared_ptr<SchemeProcedure> *func_local;
  TailContext *this_local;
  
  std::shared_ptr<SchemeProcedure>::shared_ptr(&this->func,func);
  std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  ::list(&this->args,args);
  return;
}

Assistant:

TailContext(const std::shared_ptr<SchemeProcedure> &func, const std::list<std::shared_ptr<SchemeObject>> &args) :
        func(func), args(args)
    {}